

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::PrintField
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,
          TextGenerator *generator)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined7 extraout_var;
  FastFieldValuePrinter *pFVar4;
  Message *message_00;
  char *pcVar5;
  pointer ppMVar6;
  ulong uVar7;
  undefined1 local_d8 [8];
  DynamicMessageFactory factory;
  FieldDescriptor *local_88;
  undefined4 local_7c;
  undefined1 auStack_78 [8];
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  sorted_map_field;
  
  if ((this->use_short_repeated_primitives_ == true) && (*(int *)(field + 0x3c) == 3)) {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_d8 = (undefined1  [8])FieldDescriptor::TypeOnceInit;
      auStack_78 = (undefined1  [8])field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_d8,
                 (FieldDescriptor **)auStack_78);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 9) {
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_d8 = (undefined1  [8])FieldDescriptor::TypeOnceInit;
        auStack_78 = (undefined1  [8])field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_d8,
                   (FieldDescriptor **)auStack_78);
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 10) {
        PrintShortRepeatedField(this,message,reflection,field,generator);
        return;
      }
    }
  }
  if (*(int *)(field + 0x3c) == 3) {
    uVar2 = Reflection::FieldSize(reflection,message,field);
  }
  else {
    bVar1 = Reflection::HasField(reflection,message,field);
    if ((bVar1) ||
       (uVar2 = 0, *(char *)(*(long *)(*(long *)(field + 0x50) + 0x20) + 0x4b) == '\x01')) {
      uVar2 = 1;
    }
  }
  DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)local_d8);
  auStack_78 = (undefined1  [8])0x0;
  sorted_map_field.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sorted_map_field.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    factory.prototypes_mutex_.mu_.super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)FieldDescriptor::TypeOnceInit;
    local_88 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),
               (_func_void_FieldDescriptor_ptr **)
               ((long)&factory.prototypes_mutex_.mu_.super___mutex_base._M_mutex + 0x20),&local_88);
  }
  if (*(int *)(field + 0x38) == 0xb) {
    bVar1 = FieldDescriptor::is_map_message_type(field);
    local_7c = (undefined4)CONCAT71(extraout_var,bVar1);
  }
  else {
    local_7c = 0;
  }
  if ((char)local_7c == '\0') {
    bVar1 = false;
  }
  else {
    bVar1 = internal::MapFieldPrinterHelper::SortMap
                      (message,reflection,field,(MessageFactory *)local_d8,
                       (vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                        *)auStack_78);
  }
  if (0 < (int)uVar2) {
    ppMVar6 = (pointer)0x0;
    sorted_map_field.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)uVar2;
    do {
      uVar7 = 0xffffffff;
      if (*(int *)(field + 0x3c) == 3) {
        uVar7 = (ulong)ppMVar6 & 0xffffffff;
      }
      PrintFieldName(this,message,(int)uVar7,
                     (int)sorted_map_field.
                          super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,reflection,field,
                     generator);
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        factory.prototypes_mutex_.mu_.super___mutex_base._M_mutex.__data.__list.__next =
             (__pthread_internal_list *)FieldDescriptor::TypeOnceInit;
        local_88 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),
                   (_func_void_FieldDescriptor_ptr **)
                   ((long)&factory.prototypes_mutex_.mu_.super___mutex_base._M_mutex + 0x20),
                   &local_88);
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) == 10) {
        pFVar4 = GetFieldPrinter(this,field);
        if (*(int *)(field + 0x3c) == 3) {
          if ((char)local_7c == '\0') {
            message_00 = Reflection::GetRepeatedMessage(reflection,message,field,(int)ppMVar6);
          }
          else {
            message_00 = *(Message **)((long)auStack_78 + (long)ppMVar6 * 8);
          }
        }
        else {
          message_00 = Reflection::GetMessage(reflection,message,field,(MessageFactory *)0x0);
        }
        (*pFVar4->_vptr_FastFieldValuePrinter[0xe])
                  (pFVar4,message_00,uVar7,
                   sorted_map_field.
                   super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)this->single_line_mode_
                   ,generator);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[2])();
        iVar3 = (*pFVar4->_vptr_FastFieldValuePrinter[0xf])
                          (pFVar4,message_00,uVar7,
                           sorted_map_field.
                           super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (ulong)this->single_line_mode_,generator);
        if ((char)iVar3 == '\0') {
          Print(this,message_00,generator);
        }
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[3])();
        (*pFVar4->_vptr_FastFieldValuePrinter[0x10])
                  (pFVar4,message_00,uVar7,
                   sorted_map_field.
                   super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)this->single_line_mode_
                   ,generator);
      }
      else {
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,": ",2);
        PrintFieldValue(this,message,reflection,field,(int)uVar7,generator);
        pcVar5 = "\n";
        if (this->single_line_mode_ != false) {
          pcVar5 = " ";
        }
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,pcVar5,1);
      }
      ppMVar6 = (pointer)((long)ppMVar6 + 1);
    } while (sorted_map_field.
             super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage != ppMVar6);
  }
  if ((bVar1 != false) &&
     ((undefined1  [8])
      sorted_map_field.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_start != auStack_78)) {
    uVar7 = 0;
    do {
      if (*(long **)((long)auStack_78 + uVar7 * 8) != (long *)0x0) {
        (**(code **)(**(long **)((long)auStack_78 + uVar7 * 8) + 8))();
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)sorted_map_field.
                                   super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start - (long)auStack_78 >> 3
                            ));
  }
  if (auStack_78 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_78);
  }
  DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)local_d8);
  return;
}

Assistant:

void TextFormat::Printer::PrintField(const Message& message,
                                     const Reflection* reflection,
                                     const FieldDescriptor* field,
                                     TextGenerator* generator) const {
  if (use_short_repeated_primitives_ && field->is_repeated() &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_STRING &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
    PrintShortRepeatedField(message, reflection, field, generator);
    return;
  }

  int count = 0;

  if (field->is_repeated()) {
    count = reflection->FieldSize(message, field);
  } else if (reflection->HasField(message, field) ||
             field->containing_type()->options().map_entry()) {
    count = 1;
  }

  DynamicMessageFactory factory;
  std::vector<const Message*> sorted_map_field;
  bool need_release = false;
  bool is_map = field->is_map();
  if (is_map) {
    need_release = internal::MapFieldPrinterHelper::SortMap(
        message, reflection, field, &factory, &sorted_map_field);
  }

  for (int j = 0; j < count; ++j) {
    const int field_index = field->is_repeated() ? j : -1;

    PrintFieldName(message, field_index, count, reflection, field, generator);

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      const FastFieldValuePrinter* printer = GetFieldPrinter(field);
      const Message& sub_message =
          field->is_repeated()
              ? (is_map ? *sorted_map_field[j]
                        : reflection->GetRepeatedMessage(message, field, j))
              : reflection->GetMessage(message, field);
      printer->PrintMessageStart(sub_message, field_index, count,
                                 single_line_mode_, generator);
      generator->Indent();
      if (!printer->PrintMessageContent(sub_message, field_index, count,
                                        single_line_mode_, generator)) {
        Print(sub_message, generator);
      }
      generator->Outdent();
      printer->PrintMessageEnd(sub_message, field_index, count,
                               single_line_mode_, generator);
    } else {
      generator->PrintLiteral(": ");
      // Write the field value.
      PrintFieldValue(message, reflection, field, field_index, generator);
      if (single_line_mode_) {
        generator->PrintLiteral(" ");
      } else {
        generator->PrintLiteral("\n");
      }
    }
  }

  if (need_release) {
    for (int j = 0; j < sorted_map_field.size(); ++j) {
      delete sorted_map_field[j];
    }
  }
}